

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O2

ALLEGRO_FILE * al_make_temp_file(char *template,ALLEGRO_PATH **ret_path)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  char *filename;
  ALLEGRO_PATH *path;
  char *pcVar6;
  ALLEGRO_FILE *pAVar7;
  int *piVar8;
  ulong uVar9;
  
  sVar5 = strlen(template);
  filename = (char *)al_malloc_with_context
                               (sVar5 + 1,0x1d5,
                                "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/file_stdio.c"
                                ,"al_make_temp_file");
  path = al_get_standard_path(1);
  pAVar7 = (ALLEGRO_FILE *)0x0;
  if (path != (ALLEGRO_PATH *)0x0 && filename != (char *)0x0) {
    iVar4 = 0;
    do {
      if (iVar4 == 1000) {
        piVar8 = __errno_location();
        al_set_errno(*piVar8);
        pAVar7 = (ALLEGRO_FILE *)0x0;
        goto LAB_00159d86;
      }
      sVar5 = strlen(template);
      for (uVar3 = 0; uVar9 = (ulong)uVar3, uVar9 < sVar5; uVar3 = uVar3 + 1) {
        cVar1 = template[uVar9];
        if (cVar1 == 'X') {
          iVar2 = _al_rand();
          cVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789"
                  [(ulong)(long)iVar2 % 0x3e];
        }
        filename[uVar9] = cVar1;
      }
      filename[uVar9] = '\0';
      al_set_path_filename(path,filename);
      pcVar6 = al_path_cstr(path,'/');
      iVar2 = open(pcVar6,0xc2,0x1c0);
      iVar4 = iVar4 + 1;
    } while (iVar2 == -1);
    pAVar7 = al_fopen_fd(iVar2,"rb+");
    if (pAVar7 == (ALLEGRO_FILE *)0x0) {
      piVar8 = __errno_location();
      al_set_errno(*piVar8);
      close(iVar2);
      pcVar6 = al_path_cstr(path,'/');
      unlink(pcVar6);
      pAVar7 = (ALLEGRO_FILE *)0x0;
    }
  }
LAB_00159d86:
  al_free_with_context
            (filename,0x1dd,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/file_stdio.c"
             ,"al_make_temp_file");
  if ((ret_path == (ALLEGRO_PATH **)0x0) || (pAVar7 == (ALLEGRO_FILE *)0x0)) {
    al_destroy_path(path);
  }
  else {
    *ret_path = path;
  }
  return pAVar7;
}

Assistant:

ALLEGRO_FILE *al_make_temp_file(const char *template, ALLEGRO_PATH **ret_path)
{
   char *temp_filename;
   ALLEGRO_PATH *path;
   ALLEGRO_FILE *f;

   temp_filename = al_malloc(strlen(template) + 1);
   path = al_get_standard_path(ALLEGRO_TEMP_PATH);

   if (temp_filename && path)
      f = make_temp_file(template, temp_filename, path);
   else
      f = NULL;

   al_free(temp_filename);

   if (f && ret_path)
      *ret_path = path;
   else
      al_destroy_path(path);

   return f;
}